

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool kwssys::SystemTools::FileIsExecutable(string *inName)

{
  bool bVar1;
  string *in_stack_000010c8;
  string *in_stack_ffffffffffffffe8;
  undefined1 local_9;
  
  bVar1 = FileIsDirectory(in_stack_000010c8);
  local_9 = false;
  if (!bVar1) {
    local_9 = TestFileAccess(in_stack_ffffffffffffffe8,0);
  }
  return local_9;
}

Assistant:

bool SystemTools::FileIsExecutable(const std::string& inName)
{
#ifdef _WIN32
  char local_buffer[KWSYS_SYSTEMTOOLS_MAXPATH];
  std::string string_buffer;
  const auto name = RemoveTrailingSlashes(inName, local_buffer, string_buffer);
  const auto attr =
    GetFileAttributesW(Encoding::ToWindowsExtendedPath(name).c_str());

  // On Windows any file that exists and is not a directory is considered
  // readable and therefore also executable:
  return attr != INVALID_FILE_ATTRIBUTES && !(attr & FILE_ATTRIBUTE_DIRECTORY);
#else
  return !FileIsDirectory(inName) && TestFileAccess(inName, TEST_FILE_EXECUTE);
#endif
}